

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  _Base_ptr *__k;
  _Rb_tree_header *p_Var1;
  string *this;
  pointer pcVar2;
  char cVar3;
  int iVar4;
  long lVar5;
  mapped_type *pmVar6;
  mapped_type *pmVar7;
  mapped_type *pmVar8;
  istream *piVar9;
  ostream *poVar10;
  _Rb_tree<std::pair<double,std::__cxx11::string>,std::pair<double,std::__cxx11::string>,std::_Identity<std::pair<double,std::__cxx11::string>>,std::less<std::pair<double,std::__cxx11::string>>,std::allocator<std::pair<double,std::__cxx11::string>>>
  *this_00;
  mapped_type *pmVar11;
  _Node *p_Var12;
  mapped_type *pmVar13;
  iterator iVar14;
  _Base_ptr p_Var15;
  _Self __tmp_1;
  char *pcVar16;
  int iVar17;
  _Self __tmp;
  size_t *psVar18;
  size_t *psVar19;
  undefined1 auVar20 [8];
  long lVar21;
  double dVar22;
  double dVar23;
  undefined1 local_220 [8];
  graph_t graph;
  nodes_t nodes;
  node2name_t n2n;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  lengths;
  edges_list_t result;
  string sa2;
  string sa1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  rgraph;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  processed;
  undefined1 local_a0 [8];
  edges_list_t to_visit;
  string n2;
  int local_54;
  undefined1 auStack_50 [4];
  int count;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  
  sa2.field_2._8_8_ = &sa1._M_string_length;
  sa1._M_dataplus._M_p = (pointer)0x0;
  sa1._M_string_length._0_1_ = 0;
  result.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = (size_t)&sa2._M_string_length;
  sa2._M_dataplus._M_p = (pointer)0x0;
  sa2._M_string_length._0_1_ = 0;
  cVar3 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + 'P');
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)(sa2.field_2._M_local_buf + 8),cVar3);
  cVar3 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + 'P');
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,
             (string *)
             &result.
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl._M_node._M_size,cVar3);
  std::istream::operator>>((istream *)&std::cin,&local_54);
  std::istream::ignore();
  nodes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&nodes;
  iVar17 = 0;
  nodes._M_t._M_impl._0_4_ = 0;
  nodes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  nodes._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  nodes._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  n2n._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&n2n;
  n2n._M_t._M_impl._0_4_ = 0;
  n2n._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  n2n._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  n2n._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  graph._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&graph;
  graph._M_t._M_impl._0_4_ = 0;
  graph._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  graph._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  graph._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  lengths._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&lengths;
  lengths._M_t._M_impl._0_4_ = 0;
  lengths._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  lengths._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  lengths._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  graph._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       graph._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  nodes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       nodes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  n2n._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       n2n._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  lengths._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       lengths._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (0 < local_54) {
    p_Var1 = &processed._M_t._M_impl.super__Rb_tree_header;
    this = (string *)(&sa1.field_2._M_allocated_capacity + 1);
    psVar19 = &rgraph._M_t._M_impl.super__Rb_tree_header._M_node_count;
    do {
      sa1.field_2._8_8_ = &rgraph._M_t._M_impl.super__Rb_tree_header;
      rgraph._M_t._M_impl._0_8_ = 0;
      rgraph._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           rgraph._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffffffffff00;
      cVar3 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + 'P');
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&std::cin,this,cVar3);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)auStack_50,9,(allocator_type *)psVar19);
      lVar21 = 0;
      do {
        lVar5 = std::__cxx11::string::find((char)this,0x2c);
        if (lVar5 == -1) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)auStack_50);
          if ((_Rb_tree_header *)sa1.field_2._8_8_ != &rgraph._M_t._M_impl.super__Rb_tree_header) {
            operator_delete((void *)sa1.field_2._8_8_,
                            rgraph._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
          }
          iVar17 = -1;
          goto LAB_00106325;
        }
        std::__cxx11::string::substr((ulong)psVar19,(ulong)this);
        std::__cxx11::string::operator=((string *)(_auStack_50 + lVar21),(string *)psVar19);
        if ((_Rb_tree_header *)rgraph._M_t._M_impl.super__Rb_tree_header._M_node_count != p_Var1) {
          operator_delete((void *)rgraph._M_t._M_impl.super__Rb_tree_header._M_node_count,
                          processed._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
        }
        std::__cxx11::string::substr((ulong)psVar19,(ulong)this);
        std::__cxx11::string::operator=(this,(string *)psVar19);
        if ((_Rb_tree_header *)rgraph._M_t._M_impl.super__Rb_tree_header._M_node_count != p_Var1) {
          operator_delete((void *)rgraph._M_t._M_impl.super__Rb_tree_header._M_node_count,
                          processed._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
        }
        lVar21 = lVar21 + 0x20;
      } while (lVar21 != 0x100);
      std::__cxx11::string::_M_assign((string *)(_auStack_50 + 0x100));
      unquote((string *)(_auStack_50 + 0x20));
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&nodes._M_t._M_impl.super__Rb_tree_header._M_node_count,
                            (key_type *)_auStack_50);
      std::__cxx11::string::_M_assign((string *)pmVar6);
      n2.field_2._8_8_ = get_number((string *)(_auStack_50 + 0x60));
      processed._M_t._M_impl.super__Rb_tree_header._M_node_count =
           (size_t)get_number((string *)(_auStack_50 + 0x80));
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>_>_>_>
                             *)&graph._M_t._M_impl.super__Rb_tree_header._M_node_count,
                            (key_type *)_auStack_50);
      pmVar7->first = (double)n2.field_2._8_8_;
      pmVar7->second = (double)processed._M_t._M_impl.super__Rb_tree_header._M_node_count;
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                    *)local_220,(key_type *)_auStack_50);
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                             *)&n2n._M_t._M_impl.super__Rb_tree_header._M_node_count,
                            (key_type *)_auStack_50);
      *pmVar8 = -1.0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)auStack_50);
      if ((_Rb_tree_header *)sa1.field_2._8_8_ != &rgraph._M_t._M_impl.super__Rb_tree_header) {
        operator_delete((void *)sa1.field_2._8_8_,
                        rgraph._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
      }
      iVar17 = iVar17 + 1;
    } while (iVar17 < local_54);
  }
  std::istream::operator>>((istream *)&std::cin,&local_54);
  std::istream::ignore();
  rgraph._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&rgraph;
  rgraph._M_t._M_impl._0_8_ = rgraph._M_t._M_impl._0_8_ & 0xffffffff00000000;
  rgraph._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  rgraph._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  rgraph._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  rgraph._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       rgraph._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (0 < local_54) {
    iVar17 = 0;
    do {
      _auStack_50 = (pointer)&parts.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
      parts.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      parts.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
      to_visit.
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node._M_size = (size_t)&n2._M_string_length;
      n2._M_dataplus._M_p = (pointer)0x0;
      n2._M_string_length._0_1_ = 0;
      piVar9 = std::operator>>((istream *)&std::cin,(string *)auStack_50);
      std::operator>>(piVar9,(string *)
                             &to_visit.
                              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl._M_node._M_size);
      std::istream::ignore();
      iVar4 = std::__cxx11::string::compare((char *)auStack_50);
      if (iVar4 == 0) {
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,_auStack_50,
                             (long)parts.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar10,(char *)to_visit.
                                             super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl._M_node._M_size,(long)n2._M_dataplus._M_p);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
        std::ostream::put((char)poVar10);
        std::ostream::flush();
      }
      this_00 = (_Rb_tree<std::pair<double,std::__cxx11::string>,std::pair<double,std::__cxx11::string>,std::_Identity<std::pair<double,std::__cxx11::string>>,std::less<std::pair<double,std::__cxx11::string>>,std::allocator<std::pair<double,std::__cxx11::string>>>
                 *)std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                                 *)local_220,(key_type *)auStack_50);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>_>_>_>
                             *)&graph._M_t._M_impl.super__Rb_tree_header._M_node_count,
                            (key_type *)auStack_50);
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>_>_>_>
                              *)&graph._M_t._M_impl.super__Rb_tree_header._M_node_count,
                             (key_type *)
                             &to_visit.
                              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl._M_node._M_size);
      dVar23 = pmVar7->first;
      n2.field_2._8_8_ = pmVar11->second - pmVar7->second;
      processed._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)pmVar11->first;
      dVar22 = cos((dVar23 + (double)processed._M_t._M_impl.super__Rb_tree_header._M_node_count) *
                   0.5);
      dVar23 = (double)processed._M_t._M_impl.super__Rb_tree_header._M_node_count - dVar23;
      rgraph._M_t._M_impl.super__Rb_tree_header._M_node_count =
           (size_t)(SQRT(dVar22 * (double)n2.field_2._8_8_ * dVar22 * (double)n2.field_2._8_8_ +
                         dVar23 * dVar23) * 6371.0);
      processed._M_t._M_impl._0_8_ =
           &processed._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&processed,
                 to_visit.
                 super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl._M_node._M_size,
                 n2._M_dataplus._M_p +
                 to_visit.
                 super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl._M_node._M_size);
      std::
      _Rb_tree<std::pair<double,std::__cxx11::string>,std::pair<double,std::__cxx11::string>,std::_Identity<std::pair<double,std::__cxx11::string>>,std::less<std::pair<double,std::__cxx11::string>>,std::allocator<std::pair<double,std::__cxx11::string>>>
      ::_M_insert_unique<std::pair<double,std::__cxx11::string>>
                (this_00,(pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&rgraph._M_t._M_impl.super__Rb_tree_header._M_node_count);
      if ((_Base_ptr *)processed._M_t._M_impl._0_8_ !=
          &processed._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
        operator_delete((void *)processed._M_t._M_impl._0_8_,
                        (ulong)((long)&(processed._M_t._M_impl.super__Rb_tree_header._M_header.
                                       _M_parent)->_M_color + 1));
      }
      if ((size_type *)
          to_visit.
          super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl._M_node._M_size != &n2._M_string_length) {
        operator_delete((void *)to_visit.
                                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl._M_node._M_size,
                        CONCAT71(n2._M_string_length._1_7_,(undefined1)n2._M_string_length) + 1);
      }
      if ((pointer *)_auStack_50 !=
          &parts.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) {
        operator_delete(_auStack_50,
                        CONCAT71(parts.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                                 parts.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish._0_1_) + 1);
      }
      iVar17 = iVar17 + 1;
    } while (iVar17 < local_54);
  }
  processed._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&processed;
  processed._M_t._M_impl._0_8_ = processed._M_t._M_impl._0_8_ & 0xffffffff00000000;
  processed._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  processed._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  processed._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_a0 = (undefined1  [8])local_a0;
  to_visit.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
  processed._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       processed._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  to_visit.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)local_a0;
  p_Var12 = std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            _M_create_node<std::__cxx11::string_const&>
                      ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_a0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&sa2.field_2 + 8));
  std::__detail::_List_node_base::_M_hook(&p_Var12->super__List_node_base);
  to_visit.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       (_List_node_base *)
       ((long)&(to_visit.
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl._M_node.super__List_node_base._M_prev)->_M_next + 1);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&rgraph._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&sa2.field_2 + 8));
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                         *)&n2n._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        (key_type *)((long)&sa2.field_2 + 8));
  *pmVar8 = 0.0;
  if (local_a0 != (undefined1  [8])local_a0) {
    psVar19 = &n2n._M_t._M_impl.super__Rb_tree_header._M_node_count;
    do {
      psVar18 = &graph._M_t._M_impl.super__Rb_tree_header._M_node_count;
      _auStack_50 = (pointer)&parts.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
      std::__cxx11::string::_M_construct<char*>
                ((string *)auStack_50,((_List_node_base *)((long)local_a0 + 0x10))->_M_next,
                 (long)&((_List_node_base *)((long)local_a0 + 0x10))->_M_next->_M_next +
                 (long)&((_List_node_base *)((long)local_a0 + 0x10))->_M_prev->_M_next);
      for (auVar20 = local_a0; auVar20 != (undefined1  [8])local_a0;
          auVar20 = (undefined1  [8])((_List_node_base *)auVar20)->_M_next) {
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                               *)psVar19,(key_type *)auStack_50);
        dVar23 = *pmVar8;
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                               *)psVar19,(key_type *)((long)auVar20 + 0x10));
        if (*pmVar8 <= dVar23 && dVar23 != *pmVar8) {
          std::__cxx11::string::_M_assign((string *)auStack_50);
        }
      }
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::remove((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_a0,(char *)auStack_50);
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                             *)psVar19,(key_type *)auStack_50);
      iVar17 = main::C;
      n2.field_2._8_8_ = *pmVar8;
      main::C = main::C + 1;
      poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar17);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,". check node ",0xd);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&nodes._M_t._M_impl.super__Rb_tree_header._M_node_count,
                            (key_type *)auStack_50);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,(pmVar6->_M_dataplus)._M_p,pmVar6->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,": ",2);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>_>_>_>
                             *)psVar18,(key_type *)auStack_50);
      poVar10 = std::ostream::_M_insert<double>(pmVar7->first);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,", ",2);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>_>_>_>
                             *)psVar18,(key_type *)auStack_50);
      poVar10 = std::ostream::_M_insert<double>(pmVar7->second);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      pmVar13 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                              *)local_220,(key_type *)auStack_50);
      p_Var15 = (pmVar13->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      while( true ) {
        pmVar13 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                                *)local_220,(key_type *)auStack_50);
        if ((_Rb_tree_header *)p_Var15 == &(pmVar13->_M_t)._M_impl.super__Rb_tree_header) break;
        __k = &p_Var15[1]._M_parent;
        iVar14 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&rgraph._M_t._M_impl.super__Rb_tree_header._M_node_count,(key_type *)__k)
        ;
        if ((_Base_ptr)&processed == iVar14._M_node) {
          p_Var12 = std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    _M_create_node<std::__cxx11::string_const&>
                              ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               local_a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)__k);
          std::__detail::_List_node_base::_M_hook(&p_Var12->super__List_node_base);
          to_visit.
          super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl._M_node.super__List_node_base._M_prev =
               (_List_node_base *)
               ((long)&(to_visit.
                        super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl._M_node.super__List_node_base._M_prev)->_M_next + 1);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&rgraph._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k);
        }
        dVar23 = *(double *)(p_Var15 + 1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"w = ",4);
        poVar10 = std::ostream::_M_insert<double>((double)n2.field_2._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\td = ",5);
        poVar10 = std::ostream::_M_insert<double>(dVar23);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\tcurrent (",10);
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&nodes._M_t._M_impl.super__Rb_tree_header._M_node_count,
                              (key_type *)__k);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar10,(pmVar6->_M_dataplus)._M_p,pmVar6->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"): ",3);
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                               *)psVar19,(key_type *)__k);
        poVar10 = std::ostream::_M_insert<double>(*pmVar8);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
        std::ostream::put((char)poVar10);
        std::ostream::flush();
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                               *)psVar19,(key_type *)__k);
        if ((*pmVar8 != -1.0) || (NAN(*pmVar8))) {
          pmVar8 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                                 *)psVar19,(key_type *)__k);
          lVar21 = 4;
          pcVar16 = "skip";
          if ((double)n2.field_2._8_8_ + dVar23 < *pmVar8) goto LAB_00105ee9;
        }
        else {
LAB_00105ee9:
          pmVar8 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                                 *)psVar19,(key_type *)__k);
          *pmVar8 = dVar23 + (double)n2.field_2._8_8_;
          pmVar6 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)((long)&sa1.field_2 + 8),(key_type *)__k);
          lVar21 = 0xb;
          std::__cxx11::string::_M_assign((string *)pmVar6);
          pcVar16 = "update path";
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar16,lVar21);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'x');
        std::ostream::put('x');
        std::ostream::flush();
        p_Var15 = (_Base_ptr)std::_Rb_tree_increment(p_Var15);
      }
      if ((pointer *)_auStack_50 !=
          &parts.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) {
        operator_delete(_auStack_50,
                        CONCAT71(parts.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                                 parts.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish._0_1_) + 1);
      }
    } while (local_a0 != (undefined1  [8])local_a0);
  }
  if (lengths._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)&lengths) {
    p_Var15 = lengths._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&nodes._M_t._M_impl.super__Rb_tree_header._M_node_count,
                            (key_type *)(p_Var15 + 1));
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,(pmVar6->_M_dataplus)._M_p,pmVar6->_M_string_length
                          );
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,": ",2);
      poVar10 = std::ostream::_M_insert<double>(*(double *)(p_Var15 + 2));
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      p_Var15 = (_Base_ptr)std::_Rb_tree_increment(p_Var15);
    } while (p_Var15 != (_Rb_tree_node_base *)&lengths);
  }
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                         *)&n2n._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        (key_type *)
                        &result.
                         super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl._M_node._M_size);
  if ((*pmVar8 != -1.0) || (NAN(*pmVar8))) {
    lengths._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)&lengths._M_t._M_impl.super__Rb_tree_header._M_node_count;
    result.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
    _auStack_50 = (pointer)&parts.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
    result.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_next =
         (_List_node_base *)lengths._M_t._M_impl.super__Rb_tree_header._M_node_count;
    std::__cxx11::string::_M_construct<char*>
              ((string *)auStack_50,
               result.
               super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl._M_node._M_size,
               sa2._M_dataplus._M_p +
               result.
               super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl._M_node._M_size);
    p_Var12 = std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              _M_create_node<std::__cxx11::string_const&>
                        ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &lengths._M_t._M_impl.super__Rb_tree_header._M_node_count,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &result.
                          super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl._M_node._M_size);
    std::__detail::_List_node_base::_M_hook(&p_Var12->super__List_node_base);
    psVar18 = &lengths._M_t._M_impl.super__Rb_tree_header._M_node_count;
    result.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev =
         (_List_node_base *)
         ((long)&(result.
                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl._M_node.super__List_node_base._M_prev)->_M_next + 1);
    psVar19 = &to_visit.
               super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl._M_node._M_size;
LAB_00106166:
    if ((pointer)sa1._M_dataplus._M_p ==
        parts.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      if (sa1._M_dataplus._M_p == (pointer)0x0) goto LAB_00106279;
      iVar17 = bcmp((void *)sa2.field_2._8_8_,_auStack_50,(size_t)sa1._M_dataplus._M_p);
      if (iVar17 == 0) goto LAB_00106279;
    }
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)((long)&sa1.field_2 + 8),(key_type *)auStack_50);
    pcVar2 = (pmVar6->_M_dataplus)._M_p;
    to_visit.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node._M_size = (size_t)&n2._M_string_length;
    std::__cxx11::string::_M_construct<char*>
              ((string *)psVar19,pcVar2,pcVar2 + pmVar6->_M_string_length);
    p_Var12 = std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              _M_create_node<std::__cxx11::string_const&>
                        ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)psVar18,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         psVar19);
    std::__detail::_List_node_base::_M_hook(&p_Var12->super__List_node_base);
    result.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev =
         (_List_node_base *)
         ((long)&(result.
                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl._M_node.super__List_node_base._M_prev)->_M_next + 1);
    std::__cxx11::string::_M_assign((string *)auStack_50);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&nodes._M_t._M_impl.super__Rb_tree_header._M_node_count,
                          (key_type *)psVar19);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(pmVar6->_M_dataplus)._M_p,pmVar6->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,":\t",2);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,(char *)to_visit.
                                         super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl._M_node._M_size,(long)n2._M_dataplus._M_p);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    if ((size_type *)
        to_visit.
        super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl._M_node._M_size != &n2._M_string_length) {
      operator_delete((void *)to_visit.
                              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl._M_node._M_size,
                      CONCAT71(n2._M_string_length._1_7_,(undefined1)n2._M_string_length) + 1);
    }
    goto LAB_00106166;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"IMPOSSIBLE",10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
  std::ostream::put(-0x10);
  std::ostream::flush();
LAB_001062ff:
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_a0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&rgraph._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)((long)&sa1.field_2 + 8));
  iVar17 = 0;
LAB_00106325:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
               *)&n2n._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
               *)local_220);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&nodes._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>_>_>_>
               *)&graph._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if ((size_type *)
      result.
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node._M_size != &sa2._M_string_length) {
    operator_delete((void *)result.
                            super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl._M_node._M_size,
                    CONCAT71(sa2._M_string_length._1_7_,(undefined1)sa2._M_string_length) + 1);
  }
  if ((size_type *)sa2.field_2._8_8_ != &sa1._M_string_length) {
    operator_delete((void *)sa2.field_2._8_8_,
                    CONCAT71(sa1._M_string_length._1_7_,(undefined1)sa1._M_string_length) + 1);
  }
  return iVar17;
LAB_00106279:
  psVar19 = psVar18;
  while (psVar19 = (size_t *)*psVar19, psVar19 != psVar18) {
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&nodes._M_t._M_impl.super__Rb_tree_header._M_node_count,
                          (key_type *)(psVar19 + 2));
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,(pmVar6->_M_dataplus)._M_p,pmVar6->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
  }
  if ((pointer *)_auStack_50 !=
      &parts.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) {
    operator_delete(_auStack_50,
                    CONCAT71(parts.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                             parts.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish._0_1_) + 1);
  }
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&lengths._M_t._M_impl.super__Rb_tree_header._M_node_count);
  goto LAB_001062ff;
}

Assistant:

int main()
{
        std::string sa1, sa2;
        getline(std::cin, sa1);
        getline(std::cin, sa2);
        int count;
        std::cin >> count;
        std::cin.ignore();

        // Read nodes
        typedef std::map<std::string, std::pair<double, double> > nodes_t;
        typedef std::map<std::string, std::string> node2name_t;

        nodes_t nodes;
        node2name_t n2n;

        graph_t graph;
        std::map<std::string, double> lengths;
        for (int i = 0; i < count; i++)
        {
            std::string line;
            getline(std::cin, line);

            std::vector<std::string> parts(9);
            for (int i = 0; i < 9 - 1; i++)
            {
                size_t pos = line.find(',');
                if (pos == std::string::npos)
                {
                    //std::cout << "Invalid format: " << line << std::endl;
                    return -1;
                }
                parts[i] = line.substr(0, pos);
                line = line.substr(pos + 1);
                //std::cerr << "Part #" << i << ": " << parts[i] << std::endl;
            }
            parts[8] = line;
            unquote(parts[1]);
            n2n[parts[0]] = parts[1];
            nodes[parts[0]] = nodes_t::mapped_type(get_number(parts[3]), get_number(parts[4]));
            graph[parts[0]];
            lengths[parts[0]] = -1.0;
            //cerr << parts[1] << ": " << get_number(parts[3]) << ", " << get_number(parts[4]) << endl;
            //std::cerr << parts[0] << ": " << nodes[parts[0]].first << ", " << nodes[parts[0]].second << std::endl;
        }

        // Read edges
        std::cin >> count;
        std::cin.ignore();
        std::map<std::string, std::string> rgraph;
        for (int i = 0; i < count; i++)
        {
            std::string n1, n2;
            std::cin >> n1 >> n2;
            std::cin.ignore();
            if (n1 == "StopArea:AMER")
            {
                std::cerr << n1 << " " << n2 << std::endl;
            }
            graph[n1].insert(std::pair<double, edge_t>(_distance(nodes[n1], nodes[n2]), n2));
        }

        std::set<std::string> processed;
        edges_list_t to_visit;
        to_visit.push_back(sa1);
        processed.insert(sa1);
        lengths[sa1] = 0.0;
        while (!to_visit.empty())
        {
            std::string e = to_visit.front();
            for (edges_list_t::const_iterator i = to_visit.begin(); i != to_visit.end(); i++)
            {
                if (lengths[e] > lengths[*i])
                {
                    e = *i;
                }
            }
            to_visit.remove(e);
            double w = lengths[e];
            static int C = 1;
            std::cerr << C++ << ". check node " << n2n[e] << ": " << nodes[e].first << ", " << nodes[e].second << std::endl;
            for (edges_set_t::const_iterator i = graph[e].begin(); i != graph[e].end(); i++)
            {
                if (processed.end() == processed.find(i->second))
                {
                    to_visit.push_back(i->second);
                    processed.insert(i->second);
                }
                double d = i->first;
                std::cerr << "w = " << w << "\td = " << d << "\tcurrent (" << n2n[i->second] << "): " << lengths[i->second] << std::endl;
                if (-1.0 == lengths[i->second]
                    || w + d < lengths[i->second])
                {
                    lengths[i->second] = w + d;
                    rgraph[i->second] = e;
                    std::cerr << "update path" << std::endl;
                } else
                {
                    std::cerr << "skip" << std::endl;
                }
            }
        }

        for (std::map<std::string, double>::const_iterator i = lengths.begin(); i != lengths.end(); i++)
        {
            std::cerr << n2n[i->first] << ": " << i->second << std::endl;
        }

        // Build path
        if (-1.0 == lengths[sa2])
        {
            std::cout << "IMPOSSIBLE" << std::endl;
        } else
        {
            edges_list_t result;
            std::string n = sa2;
            result.push_front(sa2);
            while (sa1 != n)
            {
                std::string nmin = rgraph[n];
                result.push_front(nmin);
                n = nmin;
                std::cerr << n2n[nmin] << ":\t" << nmin << std::endl;
            }

            for (edges_list_t::const_iterator i = result.begin(); i != result.end(); i++)
            {
                std::cout << n2n[*i] << std::endl;
            }
        }

        return 0;
}